

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFileSystem.cpp
# Opt level: O3

bool __thiscall irr::io::CFileSystem::changeWorkingDirectoryTo(CFileSystem *this,path *newDirectory)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  undefined1 *puVar3;
  bool bVar4;
  string<char> local_40;
  
  if (*(int *)&(this->super_IFileSystem).field_0x8 == 0) {
    puVar3 = &(this->super_IFileSystem).field_0x10;
    if ((path *)puVar3 != newDirectory) {
      ::std::__cxx11::string::_M_assign((string *)puVar3);
    }
    iVar2 = chdir((newDirectory->str)._M_dataplus._M_p);
    bVar4 = iVar2 == 0;
  }
  else {
    puVar3 = &this->field_0x30;
    if ((path *)puVar3 != newDirectory) {
      ::std::__cxx11::string::_M_assign((string *)puVar3);
    }
    paVar1 = &local_40.str.field_2;
    local_40.str._M_string_length = 0;
    local_40.str.field_2._M_local_buf[0] = '\0';
    local_40.str._M_dataplus._M_p = (pointer)paVar1;
    core::string<char>::operator=(&local_40,"");
    (*(this->super_IFileSystem)._vptr_IFileSystem[0x16])(this,puVar3,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.str._M_dataplus._M_p != paVar1) {
      operator_delete(local_40.str._M_dataplus._M_p,
                      CONCAT71(local_40.str.field_2._M_allocated_capacity._1_7_,
                               local_40.str.field_2._M_local_buf[0]) + 1);
    }
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool CFileSystem::changeWorkingDirectoryTo(const io::path &newDirectory)
{
	bool success = false;

	if (FileSystemType != FILESYSTEM_NATIVE) {
		WorkingDirectory[FILESYSTEM_VIRTUAL] = newDirectory;
		// is this empty string constant really intended?
		flattenFilename(WorkingDirectory[FILESYSTEM_VIRTUAL], _IRR_TEXT(""));
		success = true;
	} else {
		WorkingDirectory[FILESYSTEM_NATIVE] = newDirectory;

#if defined(_MSC_VER)
		success = (_chdir(newDirectory.c_str()) == 0);
#else
		success = (chdir(newDirectory.c_str()) == 0);
#endif
	}

	return success;
}